

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BronKerbosch.cpp
# Opt level: O2

bool __thiscall
BronKerbosch::cliquesistent
          (BronKerbosch *this,alignment_set_t *R,alignment_set_t *P,alignment_set_t *X)

{
  bool bVar1;
  size_type sVar2;
  size_type pos;
  ostream *poVar3;
  bool bVar4;
  BronKerbosch *pBVar5;
  BronKerbosch *pBVar6;
  alignment_set_t tmp;
  alignment_set_t intersect;
  undefined1 local_d0 [32];
  alignment_set_t local_b0 [2];
  undefined1 local_70 [64];
  
  sVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first(R);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&intersect,
             (this->vertices_->
             super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + sVar2);
  intersect.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[sVar2 >> 6] =
       intersect.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start[sVar2 >> 6] | 1L << ((byte)sVar2 & 0x3f);
  pos = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next(R,sVar2);
  for (; pos != 0xffffffffffffffff;
      pos = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next(R,pos))
  {
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
              (&tmp,(this->vertices_->
                    super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + pos);
    tmp.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[pos >> 6] =
         tmp.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start[pos >> 6] | 1L << ((byte)pos & 0x3f);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator&=
              (&intersect,&tmp);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&tmp);
  }
  bVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::is_subset_of
                    (R,&intersect);
  if (bVar1) {
    boost::operator|(&tmp,P,X);
    bVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::is_subset_of
                      (&tmp,&intersect);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&tmp);
    bVar4 = true;
    if (bVar1) goto LAB_00176363;
    std::operator<<((ostream *)&std::cerr,"(P | X) - intersect:");
    boost::operator|(&tmp,P,X);
    pBVar5 = (BronKerbosch *)local_d0;
    boost::operator-((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)pBVar5,&tmp,
                     &intersect);
    printSet(pBVar5,(ostream *)&std::cerr,(alignment_set_t *)local_d0);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&tmp);
    poVar3 = std::operator<<((ostream *)&std::cerr,"vertices in P:");
    std::endl<char,std::char_traits<char>>(poVar3);
    sVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first(P);
    for (; sVar2 != 0xffffffffffffffff;
        sVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                          (P,sVar2)) {
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::operator<<(poVar3,":");
      pBVar5 = (BronKerbosch *)local_70;
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_70,
                 (this->vertices_->
                 super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + sVar2);
      printSet(pBVar5,(ostream *)&std::cerr,(alignment_set_t *)local_70);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_70);
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,"vertices in X:");
    std::endl<char,std::char_traits<char>>(poVar3);
    sVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first(X);
    pBVar5 = (BronKerbosch *)(local_d0 + 0x40);
    for (; sVar2 != 0xffffffffffffffff;
        sVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                          (X,sVar2)) {
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::operator<<(poVar3,":");
      pBVar6 = pBVar5;
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)pBVar5,
                 (this->vertices_->
                 super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + sVar2);
      printSet(pBVar6,(ostream *)&std::cerr,(alignment_set_t *)pBVar5);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)pBVar5);
    }
  }
  else {
    std::operator<<((ostream *)&std::cerr,"R - intersect:");
    pBVar5 = (BronKerbosch *)(local_d0 + 0x20);
    boost::operator-((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)pBVar5,R,
                     &intersect);
    printSet(pBVar5,(ostream *)&std::cerr,(alignment_set_t *)(local_d0 + 0x20));
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)(local_d0 + 0x20));
    poVar3 = std::operator<<((ostream *)&std::cerr,"vertices in R:");
    std::endl<char,std::char_traits<char>>(poVar3);
    sVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first(R);
    pBVar5 = (BronKerbosch *)(local_70 + 0x20);
    for (; sVar2 != 0xffffffffffffffff;
        sVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                          (R,sVar2)) {
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::operator<<(poVar3,":");
      pBVar6 = pBVar5;
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)pBVar5,
                 (this->vertices_->
                 super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + sVar2);
      printSet(pBVar6,(ostream *)&std::cerr,(alignment_set_t *)pBVar5);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)pBVar5);
    }
  }
  bVar4 = false;
LAB_00176363:
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&intersect);
  return bVar4;
}

Assistant:

bool BronKerbosch::cliquesistent(const alignment_set_t& R, const alignment_set_t& P, const alignment_set_t& X) {
    auto i = R.find_first();
    alignment_set_t intersect((*vertices_)[i]);
    intersect.set(i);

    for (i=R.find_next(i); i != alignment_set_t::npos; i = R.find_next(i)) {
        alignment_set_t tmp((*vertices_)[i]);
        tmp.set(i);

        intersect &= tmp;
    }
    if (not R.is_subset_of(intersect)) {
        cerr << "R - intersect:";
        printSet(cerr, R - intersect);
        cerr << "vertices in R:" << endl;
        for (auto i=R.find_first(); i != alignment_set_t::npos; i = R.find_next(i)) {
            cerr << i << ":";
            printSet(cerr, (*vertices_)[i]);
        }
        return false;
    }
    if (not (P | X).is_subset_of(intersect)) {
        cerr << "(P | X) - intersect:";
        printSet(cerr, (P | X) - intersect);
        cerr << "vertices in P:" << endl;
        for (auto i=P.find_first(); i != alignment_set_t::npos; i = P.find_next(i)) {
            cerr << i << ":";
            printSet(cerr, (*vertices_)[i]);
        }
        cerr << "vertices in X:" << endl;
        for (auto i=X.find_first(); i != alignment_set_t::npos; i = X.find_next(i)) {
            cerr << i << ":";
            printSet(cerr, (*vertices_)[i]);
        }

        return false;
    }
    return true;
}